

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_50;
  string local_30;
  
  CLI::std::__cxx11::to_string(&local_30,*(long *)&(this->super_exception).m + 1);
  CLI::std::__cxx11::to_string(&local_50,*(unsigned_long *)&(this->super_exception).id);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            (__return_storage_ptr__,(detail *)" at line ",(char (*) [10])&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", column ",
             (char (*) [10])&local_50,in_R9);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }